

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O0

void DumpExtensions(ExtensionMap *extension,int indent)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_a9;
  undefined1 local_a8 [80];
  string local_58 [32];
  reference local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>
  *e;
  const_iterator __end1;
  const_iterator __begin1;
  ExtensionMap *__range1;
  int indent_local;
  ExtensionMap *extension_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
           ::begin(extension);
  e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
         ::end(extension);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&e);
    if (!bVar1) break;
    local_38 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
               ::operator*(&__end1);
    Indent_abi_cxx11_((int)local_58);
    poVar2 = std::operator<<((ostream *)&std::cout,local_58);
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,"extensions",&local_a9);
    PrintValue((string *)(local_a8 + 0x20),(Value *)local_a8,(int)local_38 + 0x20,
               (bool)((char)indent + '\x01'));
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(local_a8 + 0x20));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void DumpExtensions(const tinygltf::ExtensionMap &extension,
                           const int indent) {
  // TODO(syoyo): pritty print Value
  for (auto &e : extension) {
    std::cout << Indent(indent) << e.first << std::endl;
    std::cout << PrintValue("extensions", e.second, indent + 1) << std::endl;
  }
}